

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O3

decimal * simdjson::internal::parse_decimal(decimal *__return_storage_ptr__,char **p)

{
  int iVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  byte *pbVar5;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  int iVar9;
  
  __return_storage_ptr__->num_digits = 0;
  __return_storage_ptr__->decimal_point = 0;
  __return_storage_ptr__->truncated = false;
  pbVar2 = (byte *)*p;
  bVar8 = *pbVar2;
  __return_storage_ptr__->negative = bVar8 == 0x2d;
  if ((bVar8 == 0x2d) || (pbVar5 = pbVar2, bVar8 == 0x2b)) {
    pbVar5 = pbVar2 + 1;
    *p = (char *)pbVar5;
    bVar8 = pbVar2[1];
  }
  while (bVar8 == 0x30) {
    pbVar5 = pbVar5 + 1;
    *p = (char *)pbVar5;
    bVar8 = *pbVar5;
  }
  bVar3 = bVar8 - 0x30;
  if (bVar3 < 10) {
    uVar7 = 0;
    pbVar2 = pbVar5 + 1;
    do {
      pbVar5 = pbVar2;
      if ((uint)uVar7 < 0x300) {
        __return_storage_ptr__->digits[uVar7] = bVar3;
      }
      uVar6 = (uint)uVar7 + 1;
      uVar7 = (ulong)uVar6;
      *p = (char *)pbVar5;
      bVar8 = *pbVar5;
      bVar3 = bVar8 - 0x30;
      pbVar2 = pbVar5 + 1;
    } while (bVar3 < 10);
    __return_storage_ptr__->num_digits = uVar6;
    if (bVar8 == 0x2e) {
      *p = (char *)pbVar2;
      if (uVar6 == 0) goto LAB_00154a6e;
      bVar8 = *pbVar2;
      pbVar5 = pbVar2;
      goto LAB_00154a94;
    }
    iVar1 = 0;
  }
  else {
    __return_storage_ptr__->num_digits = 0;
    iVar1 = 0;
    if (bVar8 != 0x2e) goto LAB_00154b24;
    pbVar2 = pbVar5 + 1;
    *p = (char *)pbVar2;
LAB_00154a6e:
    uVar7 = 0;
    bVar8 = *pbVar2;
    pbVar5 = pbVar2;
    while (bVar8 == 0x30) {
      pbVar5 = pbVar5 + 1;
      *p = (char *)pbVar5;
      bVar8 = *pbVar5;
    }
LAB_00154a94:
    uVar6 = (uint)uVar7;
    while ((byte)(bVar8 - 0x30) < 10) {
      pbVar5 = pbVar5 + 1;
      if ((uint)uVar7 < 0x300) {
        __return_storage_ptr__->digits[uVar7] = bVar8 - 0x30;
      }
      uVar6 = (uint)uVar7 + 1;
      uVar7 = (ulong)uVar6;
      *p = (char *)pbVar5;
      bVar8 = *pbVar5;
    }
    __return_storage_ptr__->num_digits = uVar6;
    iVar1 = (int)pbVar2 - (int)pbVar5;
    __return_storage_ptr__->decimal_point = iVar1;
  }
  if (uVar6 != 0) {
    iVar9 = 0;
    pbVar2 = pbVar5;
    while( true ) {
      pbVar2 = pbVar2 + -1;
      bVar8 = *pbVar2;
      if ((bVar8 != 0x30) && (bVar8 != 0x2e)) break;
      iVar9 = iVar9 + (uint)(bVar8 == 0x30);
    }
    iVar1 = iVar1 + uVar6;
    __return_storage_ptr__->decimal_point = iVar1;
    __return_storage_ptr__->num_digits = uVar6 - iVar9;
    if (0x300 < uVar6 - iVar9) {
      __return_storage_ptr__->num_digits = 0x300;
      __return_storage_ptr__->truncated = true;
    }
  }
LAB_00154b24:
  if ((*pbVar5 | 0x20) == 0x65) {
    pbVar2 = pbVar5 + 1;
    *p = (char *)pbVar2;
    bVar8 = pbVar5[1];
    if ((bVar8 == 0x2d) || (bVar8 == 0x2b)) {
      pbVar2 = pbVar5 + 2;
      *p = (char *)pbVar2;
    }
    bVar3 = *pbVar2 - 0x30;
    iVar9 = 0;
    if (bVar3 < 10) {
      iVar9 = 0;
      do {
        pbVar2 = pbVar2 + 1;
        iVar4 = (uint)bVar3 + iVar9 * 10;
        if (0xffff < iVar9) {
          iVar4 = iVar9;
        }
        iVar9 = iVar4;
        *p = (char *)pbVar2;
        bVar3 = *pbVar2 - 0x30;
      } while (bVar3 < 10);
    }
    iVar4 = -iVar9;
    if (bVar8 != 0x2d) {
      iVar4 = iVar9;
    }
    __return_storage_ptr__->decimal_point = iVar1 + iVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

decimal parse_decimal(const char *&p) noexcept {
  decimal answer;
  answer.num_digits = 0;
  answer.decimal_point = 0;
  answer.truncated = false;
  answer.negative = (*p == '-');
  if ((*p == '-') || (*p == '+')) {
    ++p;
  }

  while (*p == '0') {
    ++p;
  }
  while (is_integer(*p)) {
    if (answer.num_digits < max_digits) {
      answer.digits[answer.num_digits] = uint8_t(*p - '0');
    }
    answer.num_digits++;
    ++p;
  }
  if (*p == '.') {
    ++p;
    const char *first_after_period = p;
    // if we have not yet encountered a zero, we have to skip it as well
    if (answer.num_digits == 0) {
      // skip zeros
      while (*p == '0') {
        ++p;
      }
    }
    while (is_integer(*p)) {
      if (answer.num_digits < max_digits) {
        answer.digits[answer.num_digits] = uint8_t(*p - '0');
      }
      answer.num_digits++;
      ++p;
    }
    answer.decimal_point = int32_t(first_after_period - p);
  }
  if(answer.num_digits > 0) {
    const char *preverse = p - 1;
    int32_t trailing_zeros = 0;
    while ((*preverse == '0') || (*preverse == '.')) {
      if(*preverse == '0') { trailing_zeros++; };
      --preverse;
    }
    answer.decimal_point += int32_t(answer.num_digits);
    answer.num_digits -= uint32_t(trailing_zeros);
  }
  if(answer.num_digits > max_digits ) {
    answer.num_digits = max_digits;
    answer.truncated = true;
  }
  if (('e' == *p) || ('E' == *p)) {
    ++p;
    bool neg_exp = false;
    if ('-' == *p) {
      neg_exp = true;
      ++p;
    } else if ('+' == *p) {
      ++p;
    }
    int32_t exp_number = 0; // exponential part
    while (is_integer(*p)) {
      uint8_t digit = uint8_t(*p - '0');
      if (exp_number < 0x10000) {
        exp_number = 10 * exp_number + digit;
      }
      ++p;
    }
    answer.decimal_point += (neg_exp ? -exp_number : exp_number);
  }
  return answer;
}